

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::Semaphore>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::Semaphore> *this)

{
  RefData<vk::Handle<(vk::HandleType)4>_> data;
  int iVar1;
  Move<vk::Handle<(vk::HandleType)4>_> local_80;
  RefData<vk::Handle<(vk::HandleType)4>_> local_60;
  undefined1 local_40 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> obj;
  int iterNdx;
  int itersBetweenSyncs;
  int numIters;
  CreateThread<vkt::api::(anonymous_namespace)::Semaphore> *this_local;
  
  iVar1 = getCreateCount<vkt::api::(anonymous_namespace)::Semaphore>();
  for (obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_ = 0;
      obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_ < iVar1;
      obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_ =
           obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_ + 1) {
    if (obj.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator._4_4_ %
        (iVar1 / 5) == 0) {
      ThreadGroupThread::barrier(&this->super_ThreadGroupThread);
    }
    Semaphore::create(&local_80,this->m_env,this->m_resources,this->m_params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_80);
    data.deleter.m_deviceIface = local_60.deleter.m_deviceIface;
    data.object.m_internal = local_60.object.m_internal;
    data.deleter.m_device = local_60.deleter.m_device;
    data.deleter.m_allocator = local_60.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_40,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_80);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_40);
  }
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}